

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

Result * __thiscall banksia::ChessBoard::probeSyzygy(ChessBoard *this,int maxPieces,bool *tberror)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 *in_RCX;
  int in_EDX;
  long in_RSI;
  Result *in_RDI;
  uint wdl;
  uint res;
  uint results [193];
  uint64_t b;
  int sd;
  Piece piece;
  int i;
  uint64_t bm [2];
  SyzygyPos pos;
  int total;
  Result *result;
  BoardCore *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  ulong in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  Piece in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined1 local_3e8 [8];
  uint64_t in_stack_fffffffffffffc20;
  uint64_t in_stack_fffffffffffffc28;
  uint in_stack_fffffffffffffc30;
  uint in_stack_fffffffffffffc38;
  uint in_stack_fffffffffffffc40;
  uint *in_stack_fffffffffffffc50;
  Piece local_d4;
  uint local_cc;
  ulong local_c8 [4];
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  byte local_70;
  undefined1 local_6f;
  char local_6e;
  byte local_6d;
  int local_54;
  undefined1 local_49;
  undefined1 *local_48;
  int local_3c;
  
  *in_RCX = 0;
  local_49 = 0;
  local_48 = in_RCX;
  local_3c = in_EDX;
  Result::Result((Result *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  if (((Tablebase::SyzygyTablebase::TB_LARGEST != 0) &&
      (iVar1 = toPieceCount((ChessBoard *)
                            CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                            (int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)),
      iVar1 <= local_3c)) && (iVar1 <= Tablebase::SyzygyTablebase::TB_LARGEST)) {
    local_54 = iVar1;
    memset(local_c8 + 3,0,0x48);
    memset(local_c8,0,0x10);
    for (local_cc = 0; (int)local_cc < 0x40; local_cc = local_cc + 1) {
      in_stack_fffffffffffffbe8 = BoardCore::getPiece(in_stack_fffffffffffffb98,0);
      local_d4 = in_stack_fffffffffffffbe8;
      in_stack_fffffffffffffbe7 = Piece::isEmpty(&local_d4);
      if (!(bool)in_stack_fffffffffffffbe7) {
        uVar3 = 1L << (((byte)local_cc & 7) + ('\a' - (char)(local_cc >> 3)) * '\b' & 0x3f);
        local_c8[(int)local_d4.side] = local_c8[(int)local_d4.side] | uVar3;
        in_stack_fffffffffffffbd8 = (ulong)(local_d4.type - king);
        switch(in_stack_fffffffffffffbd8) {
        case 0:
          local_a0 = uVar3 | local_a0;
          break;
        case 1:
          local_98 = uVar3 | local_98;
          break;
        case 2:
          local_90 = uVar3 | local_90;
          break;
        case 3:
          local_88 = uVar3 | local_88;
          break;
        case 4:
          local_80 = uVar3 | local_80;
          break;
        case 5:
          local_78 = uVar3 | local_78;
        }
      }
    }
    local_c8[3] = local_c8[1];
    local_a8 = local_c8[0];
    local_6d = *(int *)(in_RSI + 0x20) == 1;
    if ((int)*(char *)(in_RSI + 0xb4) + (int)*(char *)(in_RSI + 0xb5) != 0) {
      if (((int)*(char *)(in_RSI + 0xb4) & *(uint *)(in_RSI + 0xa4)) != 0) {
        local_70 = local_70 | 4;
      }
      if (((int)*(char *)(in_RSI + 0xb4) & *(uint *)(in_RSI + 0xa0)) != 0) {
        local_70 = local_70 | 8;
      }
      if (((int)*(char *)(in_RSI + 0xb5) & *(uint *)(in_RSI + 0xa4)) != 0) {
        local_70 = local_70 | 1;
      }
      if (((int)*(char *)(in_RSI + 0xb5) & *(uint *)(in_RSI + 0xa0)) != 0) {
        local_70 = local_70 | 2;
      }
    }
    if (0 < *(int *)(in_RSI + 0xb0)) {
      local_6e = ('\a' - (char)(*(int *)(in_RSI + 0xb0) >> 3)) * '\b' +
                 ((byte)*(undefined4 *)(in_RSI + 0xb0) & 7);
    }
    local_6f = *(undefined1 *)(in_RSI + 0x70);
    uVar2 = Tablebase::SyzygyTablebase::tb_probe_root
                      (CONCAT44(iVar1,in_stack_fffffffffffffbf0),(uint64_t)in_stack_fffffffffffffbe8
                       ,CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       in_stack_fffffffffffffbd8,
                       CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                       (uint64_t)local_3e8,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28,
                       in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,in_stack_fffffffffffffc40
                       ,SUB41((uint)in_stack_fffffffffffffbc4 >> 0x18,0),in_stack_fffffffffffffc50);
    if (uVar2 == 0xffffffff) {
      *local_48 = 1;
    }
    else {
      uVar2 = uVar2 & 0xf;
      if ((local_6d & 1) == 0) {
        uVar2 = 4 - uVar2;
      }
      in_RDI->result = probeSyzygy::typeArray[uVar2];
      in_RDI->reason = adjudication;
    }
  }
  return in_RDI;
}

Assistant:

Result ChessBoard::probeSyzygy(int maxPieces, bool& tberror) const
{
    tberror = false;
    Result result;
    if (!Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    auto total = toPieceCount(nullptr);
    if (total > maxPieces || total > Tablebase::SyzygyTablebase::TB_LARGEST) {
        return result;
    }
    
    SyzygyPos pos;
    memset(&pos, 0, sizeof(pos));
    
    uint64_t bm[2] = { 0, 0 };
    
    for(int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) continue;
        auto sd = static_cast<int>(piece.side);
        
        uint64_t b = 1ULL << ((7 - (i >> 3)) * 8 + (i & 0x7));
        bm[sd] |= b;
        
        switch (piece.type) {
            case PieceType::king:
                pos.kings |= b;
                break;
            case PieceType::queen:
                pos.queens |= b;
                break;
            case PieceType::rook:
                pos.rooks |= b;
                break;
            case PieceType::bishop:
                pos.bishops |= b;
                break;
            case PieceType::knight:
                pos.knights |= b;
                break;
            case PieceType::pawn:
                pos.pawns |= b;
                break;
                
            default:
                break;
        }
    }
    
    pos.white = bm[W];
    pos.black = bm[B];
    pos.turn = side == Side::white ? 1 : 0;
    
    if (castleRights[0] + castleRights[1]) {
        if (castleRights[B] & CastleRight_short) {
            pos.castling |= TB_CASTLING_k;
        }
        if (castleRights[B] & CastleRight_long) {
            pos.castling |= TB_CASTLING_q;
        }
        if (castleRights[W] & CastleRight_short) {
            pos.castling |= TB_CASTLING_K;
        }
        if (castleRights[W] & CastleRight_long) {
            pos.castling |= TB_CASTLING_Q;
        }
    }
    
    if (enpassant > 0) {
        pos.ep = (7 - (enpassant >> 3)) * 8 + (enpassant & 0x7);
    }
    
    pos.rule50 = quietCnt;
    
    unsigned results[TB_MAX_MOVES];
    unsigned res = Tablebase::SyzygyTablebase::tb_probe_root(pos.white, pos.black, pos.kings,
                                            pos.queens, pos.rooks, pos.bishops, pos.knights, pos.pawns,
                                            pos.rule50, pos.castling, pos.ep, pos.turn, results);
    if (res == TB_RESULT_FAILED)
    {
//        printOut();
//        std::cerr << "Error: unable to probe tablebase; position invalid, illegal or not in tablebase" << std::endl;
        tberror = true;
        return result;
    }
    
    // (3) Output:
    unsigned wdl = TB_GET_WDL(res);
    
    static const ResultType typeArray[] = {
        ResultType::loss,
        ResultType::draw, ResultType::draw, ResultType::draw,
        ResultType::win
    };
    
    result.result = typeArray[pos.turn? wdl: 4 - wdl];
    result.reason = ReasonType::adjudication;
    return result;
}